

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapBoundFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *pSVar1;
  SnapBoundFunctionInfo *pSVar2;
  RecyclableObject *pRVar3;
  RecyclableObject *bThis;
  Recycler *this;
  WriteBarrierPtr<void> *args;
  Var ptr;
  uint i;
  ulong uVar4;
  uint ct;
  WriteBarrierPtr<void> *this_00;
  undefined1 local_78 [8];
  TrackAllocData data;
  
  pSVar1 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pSVar2 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapBoundFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)8>
                     (snpObject);
  pRVar3 = InflateMap::LookupObject(inflator,pSVar2->TargetFunction);
  ct = 0;
  if (pSVar2->BoundThis == 0) {
    bThis = (RecyclableObject *)0x0;
  }
  else {
    bThis = InflateMap::LookupObject(inflator,pSVar2->BoundThis);
  }
  if ((ulong)pSVar2->ArgCount == 0) {
    args = (Type *)0x0;
  }
  else {
    local_78 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_416bdc7;
    data.filename._0_4_ = 0x3ac;
    data.plusSize = (ulong)pSVar2->ArgCount;
    data._32_8_ = pSVar1;
    this = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)local_78);
    args = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                     ((Memory *)this,(Recycler *)Memory::Recycler::Alloc,0,(ulong)pSVar2->ArgCount);
    this_00 = args;
    for (uVar4 = 0; ct = pSVar2->ArgCount, pSVar1 = (ScriptContext *)data._32_8_, uVar4 < ct;
        uVar4 = uVar4 + 1) {
      ptr = InflateMap::InflateTTDVar(inflator,pSVar2->ArgArray[uVar4]);
      Memory::WriteBarrierPtr<void>::WriteBarrierSet(this_00,ptr);
      this_00 = this_00 + 1;
    }
  }
  pRVar3 = Js::JavascriptLibrary::CreateBoundFunction_TTD
                     ((pSVar1->super_ScriptContextBase).javascriptLibrary,pRVar3,bThis,ct,args);
  return pRVar3;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapBoundFunctionInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            //Bound functions are not too common and have special internal state so it seems easiest to always re-create them.
            //We can re-evaluate this choice later if needed.

            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapBoundFunctionInfo* snapBoundInfo = SnapObjectGetAddtlInfoAs<SnapBoundFunctionInfo*, SnapObjectType::SnapBoundFunctionObject>(snpObject);

            Js::RecyclableObject* bFunction = inflator->LookupObject(snapBoundInfo->TargetFunction);
            Js::RecyclableObject* bThis = (snapBoundInfo->BoundThis != TTD_INVALID_PTR_ID) ? inflator->LookupObject(snapBoundInfo->BoundThis) : nullptr;

            Field(Js::Var)* bArgs = nullptr;
            if(snapBoundInfo->ArgCount != 0)
            {
                bArgs = RecyclerNewArray(ctx->GetRecycler(), Field(Js::Var), snapBoundInfo->ArgCount);

                for(uint i = 0; i < snapBoundInfo->ArgCount; i++)
                {
                    bArgs[i] = inflator->InflateTTDVar(snapBoundInfo->ArgArray[i]);
                }
            }

            return ctx->GetLibrary()->CreateBoundFunction_TTD(bFunction, bThis, snapBoundInfo->ArgCount, bArgs);
        }